

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  Layer *pLVar3;
  void *pvVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  void *pvVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  size_t sVar43;
  undefined7 uVar46;
  Option *pOVar44;
  undefined1 (*pauVar45) [64];
  uint uVar47;
  undefined1 (*pauVar48) [64];
  int iVar49;
  size_t _elemsize;
  bool bVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  v4sf one;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_ZMM30 [64];
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_240;
  ulong local_238;
  Mat local_208;
  Mat local_1b8;
  Mat local_168;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  _func_int ***local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  int iStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 auVar66 [16];
  
  auVar64 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar28 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar28;
  }
  uVar32 = bottom_blob->c;
  uVar30 = (ulong)uVar32;
  uVar37 = bottom_blob->elemsize;
  iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar49 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar34 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar35 = bottom_blob->elempack;
  local_208.cstep = 0;
  local_208.data = (Allocator *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elempack = 0;
  local_208.elemsize._4_4_ = (int)local_208.refcount;
  local_208.allocator = (Allocator *)local_208.data;
  local_208.dims = (int)local_208.refcount;
  local_208.w = local_208.refcount._4_4_;
  local_208.h = (int)local_208.elemsize;
  local_208.d = (int)local_208.refcount;
  local_208.c = local_208.elempack;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_208,opt);
  iVar27 = local_208.w;
  iVar33 = -100;
  if (((Allocator *)local_208.data == (Allocator *)0x0) ||
     ((long)local_208.c * local_208.cstep == 0)) goto LAB_004163b5;
  iVar28 = (~((iVar28 + -1) * iVar49) + local_208.w) / (this->super_ConvolutionDepthWise).stride_w;
  uVar39 = iVar28 + 1;
  iVar49 = (~((iVar34 + -1) * iVar29) + local_208.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar47 = 1;
  if (opt->use_packing_layout == true) {
    uVar47 = (this->super_ConvolutionDepthWise).num_output;
    if ((uVar47 & 0xf) == 0) {
      uVar47 = 0x10;
    }
    else if ((uVar47 & 7) == 0) {
      uVar47 = 8;
    }
    else {
      uVar47 = (uint)((uVar47 & 3) == 0) * 3 + 1;
    }
  }
  _elemsize = (uVar37 / (ulong)(long)iVar35) * (ulong)uVar47;
  sVar43 = _elemsize;
  Mat::create(top_blob,uVar39,iVar49 + 1,(this->super_ConvolutionDepthWise).num_output / (int)uVar47
              ,_elemsize,uVar47,opt->blob_allocator);
  iVar33 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_004163b5;
  iVar34 = (this->super_ConvolutionDepthWise).num_output;
  iVar29 = (this->super_ConvolutionDepthWise).group;
  if (iVar29 != iVar34 || iVar35 * uVar32 != iVar29) {
LAB_00414f27:
    uVar37 = (long)(int)(iVar35 * uVar32) / (long)iVar29;
    uVar30 = (long)iVar34 / (long)iVar29;
    iVar28 = 1;
    uVar32 = 1;
    if (opt->use_packing_layout == true) {
      uVar32 = 0x10;
      iVar28 = 0x10;
      if ((uVar37 & 0xf) != 0) {
        if ((uVar37 & 7) == 0) {
          iVar28 = 8;
        }
        else {
          iVar28 = (uint)((uVar37 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar30 & 0xf) != 0) {
        if ((uVar30 & 7) == 0) {
          uVar32 = 8;
        }
        else {
          uVar32 = (uint)((uVar30 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
    local_1b8.data = local_208.data;
    local_1b8.refcount._0_4_ = (int)local_208.refcount;
    local_1b8.refcount._4_4_ = local_208.refcount._4_4_;
    local_1b8.elemsize._0_4_ = (int)local_208.elemsize;
    local_1b8.elemsize._4_4_ = local_208.elemsize._4_4_;
    local_1b8.elempack = local_208.elempack;
    local_1b8.allocator = local_208.allocator;
    local_1b8.w = local_208.w;
    local_1b8.dims = local_208.dims;
    local_1b8.d = local_208.d;
    local_1b8.h = local_208.h;
    local_1b8.c = local_208.c;
    local_1b8.cstep = local_208.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    if (iVar28 < iVar35) {
      local_168.data = *(void **)opt;
      uVar19 = opt->openmp_blocktime;
      uVar20 = opt->use_winograd_convolution;
      uVar22 = opt->use_sgemm_convolution;
      uVar24 = opt->use_int8_inference;
      uVar26 = opt->use_vulkan_compute;
      uVar25 = CONCAT11(uVar26,uVar24);
      uVar23 = CONCAT21(uVar25,uVar22);
      uVar21 = CONCAT31(uVar23,uVar20);
      local_168.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_168._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_168._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_168.c._0_1_ = opt->use_winograd43_convolution;
      local_168.c._1_1_ = opt->use_winograd63_convolution;
      local_168.c._2_1_ = opt->use_a53_a55_optimized_kernel;
      local_168.c._3_1_ = opt->use_fp16_uniform;
      local_168._60_1_ = opt->use_int8_uniform;
      local_168._61_1_ = opt->use_reserved_9;
      local_168._62_1_ = opt->use_reserved_10;
      local_168._63_1_ = opt->use_reserved_11;
      local_168.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      local_168.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_168.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      local_168.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_168.elempack = uVar19;
      local_168._28_4_ = uVar21;
      convert_packing(&local_208,&local_1b8,iVar28,(Option *)&local_168);
      if (((Allocator *)local_1b8.data != (Allocator *)0x0) &&
         ((long)local_1b8.c * local_1b8.cstep != 0)) goto LAB_00415090;
      iVar33 = -100;
    }
    else {
LAB_00415090:
      piVar2 = top_blob->refcount;
      local_168.data = top_blob->data;
      local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_168.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_168.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_168.elempack = top_blob->elempack;
      local_168.allocator = top_blob->allocator;
      local_168.dims = top_blob->dims;
      local_168.w = top_blob->w;
      local_168.h = top_blob->h;
      local_168.d = top_blob->d;
      local_168.c = top_blob->c;
      local_168.cstep = top_blob->cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      if (uVar32 < uVar47) {
        Mat::create(&local_168,uVar39,iVar49 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar32,
                    (ulong)uVar32 * (_elemsize / uVar47),uVar32,opt->workspace_allocator);
        iVar33 = -100;
        if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0))
        goto LAB_0041517c;
      }
      else {
LAB_0041517c:
        iVar49 = (this->super_ConvolutionDepthWise).group;
        bVar51 = 0 < iVar49;
        if (iVar49 < 1) {
          iVar33 = -100;
        }
        else {
          iVar33 = -100;
          iVar34 = 0;
          iVar49 = 0;
          lVar42 = 0;
          do {
            local_88 = CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize);
            local_c8 = (_func_int ***)
                       ((long)(_func_int ***)local_1b8.data +
                       (long)(iVar34 / iVar28) * local_1b8.cstep * local_88);
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = (int)local_1b8.elemsize;
            iStack_b4 = local_1b8.elemsize._4_4_;
            local_b0 = local_1b8.elempack;
            local_a8 = local_1b8.allocator;
            local_88 = ((long)local_1b8.d * local_88 * (long)local_1b8.h * (long)local_1b8.w + 0xf &
                       0xfffffffffffffff0) / local_88;
            local_a0._0_4_ = local_1b8.dims;
            local_a0._4_4_ = local_1b8.w;
            uStack_98._0_4_ = local_1b8.h;
            uStack_98._4_4_ = local_1b8.d;
            local_d8 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            local_118 = (void *)((long)(iVar49 / (int)uVar32) * local_168.cstep * local_d8 +
                                (long)local_168.data);
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = (undefined4)local_168.elemsize;
            uStack_104 = local_168.elemsize._4_4_;
            local_100 = local_168.elempack;
            local_f8 = local_168.allocator;
            local_d8 = ((long)local_168.d * local_d8 * (long)local_168.h * (long)local_168.w + 0xf &
                       0xfffffffffffffff0) / local_d8;
            local_f0._0_4_ = local_168.dims;
            local_f0._4_4_ = local_168.w;
            uStack_e8._0_4_ = local_168.h;
            uStack_e8._4_4_ = local_168.d;
            pLVar3 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar42];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            uStack_58._0_1_ = opt->use_bf16_storage;
            uStack_58._1_1_ = opt->use_fp16_packed;
            uStack_58._2_1_ = opt->use_fp16_storage;
            uStack_58._3_1_ = opt->use_fp16_arithmetic;
            uStack_58._4_1_ = opt->use_int8_packed;
            uStack_58._5_1_ = opt->use_int8_storage;
            uStack_58._6_1_ = opt->use_int8_arithmetic;
            uStack_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_168.allocator;
            local_e0 = (int)uVar30 / (int)uVar32;
            local_90 = (int)uVar37 / iVar28;
            iVar29 = (*pLVar3->_vptr_Layer[7])(pLVar3,&local_c8,&local_118,&local_78);
            if (iVar29 != 0) {
              iVar33 = iVar29;
            }
            piVar2 = (int *)CONCAT44(uStack_10c,uStack_110);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (local_118 != (void *)0x0) {
                    free(local_118);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            local_d8 = 0;
            local_118 = (void *)0x0;
            uStack_110 = 0;
            uStack_10c = 0;
            local_108 = 0;
            uStack_104 = 0;
            local_100 = 0;
            local_f0 = 0;
            uStack_e8 = 0;
            local_e0 = 0;
            piVar2 = (int *)CONCAT44(uStack_bc,uStack_c0);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_a8 == (Allocator *)0x0) {
                  if (local_c8 != (_func_int ***)0x0) {
                    free(local_c8);
                  }
                }
                else {
                  (*local_a8->_vptr_Allocator[3])();
                }
              }
            }
            local_88 = 0;
            local_c8 = (_func_int ***)0x0;
            uStack_c0 = 0;
            uStack_bc = 0;
            local_b8 = 0;
            iStack_b4 = 0;
            local_b0 = 0;
            local_a0 = 0;
            uStack_98 = 0;
            local_90 = 0;
            if (iVar29 != 0) break;
            lVar42 = lVar42 + 1;
            lVar31 = (long)(this->super_ConvolutionDepthWise).group;
            iVar49 = iVar49 + (int)uVar30;
            iVar34 = iVar34 + (int)uVar37;
            bVar51 = lVar42 < lVar31;
          } while (lVar42 < lVar31);
        }
        if (!bVar51) {
          if (uVar32 < uVar47) {
            convert_packing(&local_168,top_blob,uVar47,opt);
            iVar33 = -100;
            if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
            goto LAB_004162d1;
          }
          else if (&local_168 != top_blob) {
            piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_168.data;
            top_blob->refcount = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
            top_blob->elemsize = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            top_blob->elempack = local_168.elempack;
            top_blob->allocator = local_168.allocator;
            top_blob->dims = local_168.dims;
            top_blob->w = local_168.w;
            top_blob->h = local_168.h;
            top_blob->d = local_168.d;
            top_blob->c = local_168.c;
            top_blob->cstep = local_168.cstep;
          }
          iVar33 = 0;
        }
      }
LAB_004162d1:
      piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168._56_8_ = local_168._56_8_ & 0xffffffff00000000;
    }
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_1b8.data != (Allocator *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    goto LAB_004163b5;
  }
  uVar46 = (undefined7)(sVar43 >> 8);
  if (iVar35 < 8) {
    if (iVar35 == 1) {
      auVar64._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar64._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar64._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar64._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      uVar37 = vpcmpd_avx512vl(auVar64,_DAT_005f3500,4);
      iVar28 = (this->super_ConvolutionDepthWise).stride_w;
      uVar41 = (this->super_ConvolutionDepthWise).stride_h;
      if ((uVar41 == 1 && iVar28 == 1) && (uVar37 & 0xf) == 0) {
        convdw3x3s1_sse(&local_208,top_blob,&this->weight_data_tm,
                        &(this->super_ConvolutionDepthWise).bias_data,(Option *)(ulong)uVar41);
      }
      else {
        bVar51 = (uVar37 & 0xf) == 0;
        if ((uVar41 != 2 || iVar28 != 2) || !bVar51) goto LAB_00414f27;
        convdw3x3s2_sse(&local_208,top_blob,&this->weight_data_tm,
                        &(this->super_ConvolutionDepthWise).bias_data,
                        (Option *)
                        (ulong)CONCAT31((int3)(uVar41 >> 8),(uVar41 == 2 && iVar28 == 2) && bVar51))
        ;
      }
    }
    else {
      if (iVar35 != 4) goto LAB_00414f27;
      iVar34 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar29 = (this->super_ConvolutionDepthWise).kernel_h;
      uVar47 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
      uVar41 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
      bVar17 = iVar29 == 3;
      bVar18 = iVar34 == 3;
      bVar16 = uVar47 == 0;
      bVar51 = uVar41 == 0;
      bVar50 = ((bVar17 && bVar18) && bVar16) && bVar51;
      iVar35 = (this->super_ConvolutionDepthWise).stride_w;
      iVar33 = (this->super_ConvolutionDepthWise).stride_h;
      if ((iVar33 == 1 && iVar35 == 1) && (((bVar17 && bVar18) && bVar16) && bVar51)) {
        convdw3x3s1_pack4_sse
                  (&local_208,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,(Option *)CONCAT71(uVar46,bVar50));
      }
      else if ((((bVar17 && bVar18) && bVar16) && bVar51) && (iVar33 == 2 && iVar35 == 2)) {
        convdw3x3s2_pack4_sse
                  (&local_208,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,
                   (Option *)CONCAT71(uVar46,bVar50 && (iVar33 == 2 && iVar35 == 2)));
      }
      else {
        pOVar44 = (Option *)CONCAT71(uVar46,iVar33 == 1);
        bVar51 = iVar29 != 5 || iVar34 != 5;
        if ((iVar35 != 1 || iVar33 != 1) || ((bVar51 || uVar47 != 0) || uVar41 != 0)) {
          if (((bVar51 || uVar47 != 0) || uVar41 != 0) || (iVar35 != 2 || iVar33 != 2)) {
            uVar47 = iVar29 * iVar34;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_1b8,(long)(int)uVar47,
                       (allocator_type *)&local_168);
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar34 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar29 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar35 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar33 = 0;
              iVar36 = 0;
              iVar40 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar42 = 0;
                  do {
                    *(int *)((long)local_1b8.data + (iVar40 + lVar42) * 4) = iVar36;
                    iVar36 = iVar36 + (this->super_ConvolutionDepthWise).dilation_w;
                    lVar42 = lVar42 + 1;
                  } while ((int)lVar42 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar40 = iVar40 + (int)lVar42;
                }
                iVar36 = iVar36 + (iVar27 * iVar34 - iVar29 * iVar35);
                iVar33 = iVar33 + 1;
              } while (iVar33 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < (int)uVar32) {
              iVar34 = 0;
              auVar79._8_4_ = 0x42b0c0a5;
              auVar79._0_8_ = 0x42b0c0a542b0c0a5;
              auVar79._12_4_ = 0x42b0c0a5;
              auVar80._8_4_ = 0xc2b0c0a5;
              auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar80._12_4_ = 0xc2b0c0a5;
              auVar81._8_4_ = 0x3f000000;
              auVar81._0_8_ = 0x3f0000003f000000;
              auVar81._12_4_ = 0x3f000000;
              auVar82._8_4_ = 0x3fb8aa3b;
              auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar82._12_4_ = 0x3fb8aa3b;
              auVar83._8_4_ = 0x3f800000;
              auVar83._0_8_ = 0x3f8000003f800000;
              auVar83._12_4_ = 0x3f800000;
              auVar84._8_4_ = 0x3f318000;
              auVar84._0_8_ = 0x3f3180003f318000;
              auVar84._12_4_ = 0x3f318000;
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
              auVar91._8_4_ = 0x3ab743ce;
              auVar91._0_8_ = 0x3ab743ce3ab743ce;
              auVar91._12_4_ = 0x3ab743ce;
              auVar92._8_4_ = 0x3c088908;
              auVar92._0_8_ = 0x3c0889083c088908;
              auVar92._12_4_ = 0x3c088908;
              auVar93._8_4_ = 0x3d2aa9c1;
              auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar93._12_4_ = 0x3d2aa9c1;
              auVar94._8_4_ = 0x3e2aaaaa;
              auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar94._12_4_ = 0x3e2aaaaa;
              auVar95._8_4_ = 0x3f800000;
              auVar95._0_8_ = 0x3f8000003f800000;
              auVar95._12_4_ = 0x3f800000;
              auVar96._8_4_ = 0xb95e8083;
              auVar96._0_8_ = 0xb95e8083b95e8083;
              auVar96._12_4_ = 0xb95e8083;
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
              auVar58 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
              auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
              auVar62 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
              auVar64 = vxorps_avx512vl(auVar64,auVar64);
              auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
              local_240 = 0;
              do {
                if (-1 < iVar49) {
                  pvVar38 = (void *)(top_blob->cstep * local_240 * top_blob->elemsize +
                                    (long)top_blob->data);
                  pvVar4 = (this->weight_data_tm).data;
                  iVar29 = 0;
                  do {
                    if (-1 < iVar28) {
                      uVar37 = 0;
                      do {
                        if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                          auVar73 = ZEXT816(0) << 0x40;
                        }
                        else {
                          auVar73 = *(undefined1 (*) [16])
                                     ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                     local_240 * 0x10);
                        }
                        if (0 < (int)uVar47) {
                          lVar42 = 0;
                          do {
                            auVar73 = vfmadd231ps_fma(auVar73,*(undefined1 (*) [16])
                                                               ((long)pvVar4 +
                                                               lVar42 * 4 + (long)iVar34 * 4),
                                                      *(undefined1 (*) [16])
                                                       ((long)&((Allocator *)
                                                               ((long)local_208.data +
                                                               (long)*(int *)((long)local_1b8.data +
                                                                             lVar42) * 2 * 8))->
                                                               _vptr_Allocator +
                                                       (long)((this->super_ConvolutionDepthWise).
                                                              stride_w * (int)uVar37 * 4) * 4 +
                                                       (long)(this->super_ConvolutionDepthWise).
                                                             stride_h * (long)iVar29 *
                                                       (long)local_208.w *
                                                       CONCAT44(local_208.elemsize._4_4_,
                                                                (int)local_208.elemsize) +
                                                       local_208.cstep * local_240 *
                                                       CONCAT44(local_208.elemsize._4_4_,
                                                                (int)local_208.elemsize)));
                            lVar42 = lVar42 + 4;
                          } while ((ulong)uVar47 << 2 != lVar42);
                        }
                        auVar75 = auVar73;
                        switch((this->super_ConvolutionDepthWise).activation_type) {
                        case 1:
                          auVar75 = vmaxps_avx512vl(auVar73,auVar64);
                          break;
                        case 2:
                          auVar75 = vmaxps_avx512vl(auVar73,auVar64);
                          auVar73 = vminps_avx512vl(auVar73,auVar64);
                          uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar15._4_4_ = uVar1;
                          auVar15._0_4_ = uVar1;
                          auVar15._8_4_ = uVar1;
                          auVar15._12_4_ = uVar1;
                          auVar75 = vfmadd132ps_avx512vl(auVar73,auVar75,auVar15);
                          break;
                        case 3:
                          puVar5 = (undefined4 *)
                                   (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar1 = *puVar5;
                          auVar13._4_4_ = uVar1;
                          auVar13._0_4_ = uVar1;
                          auVar13._8_4_ = uVar1;
                          auVar13._12_4_ = uVar1;
                          auVar73 = vmaxps_avx512vl(auVar73,auVar13);
                          uVar1 = puVar5[1];
                          auVar14._4_4_ = uVar1;
                          auVar14._0_4_ = uVar1;
                          auVar14._8_4_ = uVar1;
                          auVar14._12_4_ = uVar1;
                          auVar75 = vminps_avx512vl(auVar73,auVar14);
                          break;
                        case 4:
                          auVar11._8_4_ = 0x80000000;
                          auVar11._0_8_ = 0x8000000080000000;
                          auVar11._12_4_ = 0x80000000;
                          auVar73 = vxorps_avx512vl(auVar73,auVar11);
                          auVar73 = vminps_avx(auVar73,auVar79);
                          auVar75 = vmaxps_avx(auVar73,auVar80);
                          auVar68 = vfmadd231ps_fma(auVar81,auVar75,auVar82);
                          auVar100._0_4_ = (int)auVar68._0_4_;
                          auVar100._4_4_ = (int)auVar68._4_4_;
                          auVar100._8_4_ = (int)auVar68._8_4_;
                          auVar100._12_4_ = (int)auVar68._12_4_;
                          auVar73 = vcvtdq2ps_avx(auVar100);
                          uVar6 = vcmpps_avx512vl(auVar68,auVar73,1);
                          auVar68 = vsubps_avx512vl(auVar73,auVar83);
                          bVar51 = (bool)((byte)uVar6 & 1);
                          auVar74._0_4_ =
                               (float)((uint)bVar51 * auVar68._0_4_ | (uint)!bVar51 * auVar73._0_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 1) & 1);
                          auVar74._4_4_ =
                               (float)((uint)bVar51 * auVar68._4_4_ | (uint)!bVar51 * auVar73._4_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 2) & 1);
                          auVar74._8_4_ =
                               (float)((uint)bVar51 * auVar68._8_4_ | (uint)!bVar51 * auVar73._8_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 3) & 1);
                          auVar74._12_4_ =
                               (float)((uint)bVar51 * auVar68._12_4_ |
                                      (uint)!bVar51 * auVar73._12_4_);
                          auVar73 = vfmsub231ps_fma(auVar75,auVar74,auVar84);
                          auVar12._8_4_ = 0x395e8083;
                          auVar12._0_8_ = 0x395e8083395e8083;
                          auVar12._12_4_ = 0x395e8083;
                          auVar75 = vfmsub231ps_avx512vl(auVar73,auVar74,auVar12);
                          auVar86._0_4_ = auVar75._0_4_ * auVar75._0_4_;
                          auVar86._4_4_ = auVar75._4_4_ * auVar75._4_4_;
                          auVar86._8_4_ = auVar75._8_4_ * auVar75._8_4_;
                          auVar86._12_4_ = auVar75._12_4_ * auVar75._12_4_;
                          auVar73 = vfmadd213ps_fma(auVar52,auVar75,auVar91);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar75,auVar92);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar75,auVar93);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar75,auVar94);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar75,auVar81);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar86,auVar75);
                          auVar77._0_4_ = auVar73._0_4_ + 1.0;
                          auVar77._4_4_ = auVar73._4_4_ + 1.0;
                          auVar77._8_4_ = auVar73._8_4_ + 1.0;
                          auVar77._12_4_ = auVar73._12_4_ + 1.0;
                          auVar73._0_4_ = (int)auVar74._0_4_;
                          auVar73._4_4_ = (int)auVar74._4_4_;
                          auVar73._8_4_ = (int)auVar74._8_4_;
                          auVar73._12_4_ = (int)auVar74._12_4_;
                          auVar73 = vpslld_avx(auVar73,0x17);
                          auVar73 = vpaddd_avx(auVar95,auVar73);
                          auVar73 = vfmadd213ps_fma(auVar73,auVar77,auVar83);
                          auVar75 = vdivps_avx(auVar83,auVar73);
                          break;
                        case 5:
                          auVar75 = vminps_avx(auVar73,auVar79);
                          auVar68 = vmaxps_avx(auVar75,auVar80);
                          auVar66 = vfmadd213ps_fma(auVar82,auVar68,auVar81);
                          auVar97._0_4_ = (int)auVar66._0_4_;
                          auVar97._4_4_ = (int)auVar66._4_4_;
                          auVar97._8_4_ = (int)auVar66._8_4_;
                          auVar97._12_4_ = (int)auVar66._12_4_;
                          auVar75 = vcvtdq2ps_avx(auVar97);
                          uVar6 = vcmpps_avx512vl(auVar66,auVar75,1);
                          auVar66 = vsubps_avx512vl(auVar75,auVar83);
                          bVar51 = (bool)((byte)uVar6 & 1);
                          auVar67._0_4_ =
                               (float)((uint)bVar51 * auVar66._0_4_ | (uint)!bVar51 * auVar75._0_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 1) & 1);
                          auVar67._4_4_ =
                               (float)((uint)bVar51 * auVar66._4_4_ | (uint)!bVar51 * auVar75._4_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 2) & 1);
                          auVar67._8_4_ =
                               (float)((uint)bVar51 * auVar66._8_4_ | (uint)!bVar51 * auVar75._8_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 3) & 1);
                          auVar67._12_4_ =
                               (float)((uint)bVar51 * auVar66._12_4_ |
                                      (uint)!bVar51 * auVar75._12_4_);
                          auVar75 = vfmsub231ps_fma(auVar68,auVar67,auVar84);
                          auVar75 = vfnmsub231ps_fma(auVar75,auVar67,auVar96);
                          auVar87._0_4_ = auVar75._0_4_ * auVar75._0_4_;
                          auVar87._4_4_ = auVar75._4_4_ * auVar75._4_4_;
                          auVar87._8_4_ = auVar75._8_4_ * auVar75._8_4_;
                          auVar87._12_4_ = auVar75._12_4_ * auVar75._12_4_;
                          auVar68 = vfmadd213ps_avx512vl(auVar52,auVar75,auVar91);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar92);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar93);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar94);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar81);
                          auVar75 = vfmadd213ps_avx512vl(auVar68,auVar87,auVar75);
                          auVar68 = vaddps_avx512vl(auVar75,auVar83);
                          auVar88._0_4_ = (int)auVar67._0_4_;
                          auVar88._4_4_ = (int)auVar67._4_4_;
                          auVar88._8_4_ = (int)auVar67._8_4_;
                          auVar88._12_4_ = (int)auVar67._12_4_;
                          auVar75 = vpslld_avx(auVar88,0x17);
                          auVar75 = vpaddd_avx(auVar75,auVar95);
                          auVar75 = vfmadd213ps_fma(auVar75,auVar68,auVar83);
                          uVar6 = vcmpps_avx512vl(auVar75,auVar64,2);
                          auVar8._8_4_ = 0x800000;
                          auVar8._0_8_ = 0x80000000800000;
                          auVar8._12_4_ = 0x800000;
                          auVar75 = vmaxps_avx512vl(auVar75,auVar8);
                          auVar66 = vpsrld_avx(auVar75,0x17);
                          auVar98._8_4_ = 0x807fffff;
                          auVar98._0_8_ = 0x807fffff807fffff;
                          auVar98._12_4_ = 0x807fffff;
                          auVar9._8_4_ = 0x3f000000;
                          auVar9._0_8_ = 0x3f0000003f000000;
                          auVar9._12_4_ = 0x3f000000;
                          auVar75 = vpternlogd_avx512vl(auVar75,auVar98,auVar9,0xea);
                          uVar7 = vcmpps_avx512vl(auVar75,auVar53,1);
                          auVar68 = vaddps_avx512vl(auVar75,auVar54);
                          auVar75 = vaddps_avx512vl(auVar68,auVar75);
                          bVar51 = (bool)((byte)uVar7 & 1);
                          auVar69._0_4_ =
                               (float)((uint)bVar51 * auVar75._0_4_ | (uint)!bVar51 * auVar68._0_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar7 >> 1) & 1);
                          auVar69._4_4_ =
                               (float)((uint)bVar51 * auVar75._4_4_ | (uint)!bVar51 * auVar68._4_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar7 >> 2) & 1);
                          auVar69._8_4_ =
                               (float)((uint)bVar51 * auVar75._8_4_ | (uint)!bVar51 * auVar68._8_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar7 >> 3) & 1);
                          auVar69._12_4_ =
                               (float)((uint)bVar51 * auVar75._12_4_ |
                                      (uint)!bVar51 * auVar68._12_4_);
                          auVar85._0_4_ = auVar69._0_4_ * auVar69._0_4_;
                          auVar85._4_4_ = auVar69._4_4_ * auVar69._4_4_;
                          auVar85._8_4_ = auVar69._8_4_ * auVar69._8_4_;
                          auVar85._12_4_ = auVar69._12_4_ * auVar69._12_4_;
                          auVar75 = vfmadd213ps_avx512vl(auVar55,auVar69,auVar56);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar57);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar58);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar59);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar60);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar61);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar62);
                          auVar75 = vfmadd213ps_avx512vl(auVar75,auVar69,auVar63);
                          auVar68 = vmulps_avx512vl(auVar85,auVar69);
                          auVar68 = vmulps_avx512vl(auVar68,auVar75);
                          auVar10._8_4_ = 0xffffff82;
                          auVar10._0_8_ = 0xffffff82ffffff82;
                          auVar10._12_4_ = 0xffffff82;
                          auVar75 = vpaddd_avx512vl(auVar66,auVar10);
                          auVar75 = vcvtdq2ps_avx(auVar75);
                          auVar66 = vsubps_avx512vl(auVar75,auVar83);
                          bVar51 = (bool)((byte)uVar7 & 1);
                          auVar70._0_4_ =
                               (uint)bVar51 * auVar66._0_4_ | (uint)!bVar51 * auVar75._0_4_;
                          bVar51 = (bool)((byte)(uVar7 >> 1) & 1);
                          auVar70._4_4_ =
                               (uint)bVar51 * auVar66._4_4_ | (uint)!bVar51 * auVar75._4_4_;
                          bVar51 = (bool)((byte)(uVar7 >> 2) & 1);
                          auVar70._8_4_ =
                               (uint)bVar51 * auVar66._8_4_ | (uint)!bVar51 * auVar75._8_4_;
                          bVar51 = (bool)((byte)(uVar7 >> 3) & 1);
                          auVar70._12_4_ =
                               (uint)bVar51 * auVar66._12_4_ | (uint)!bVar51 * auVar75._12_4_;
                          auVar75 = vfmadd231ps_avx512vl(auVar68,auVar70,auVar96);
                          auVar75 = vfmsub231ps_avx512vl(auVar75,auVar81,auVar85);
                          auVar75 = vsubps_avx512vl(auVar75,auVar69);
                          auVar75 = vfnmadd231ps_fma(auVar75,auVar84,auVar70);
                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          bVar51 = (bool)((byte)uVar6 & 1);
                          auVar71._0_4_ =
                               (uint)bVar51 * auVar68._0_4_ |
                               (uint)!bVar51 * (int)(auVar75._0_4_ + auVar75._0_4_);
                          bVar51 = (bool)((byte)(uVar6 >> 1) & 1);
                          auVar71._4_4_ =
                               (uint)bVar51 * auVar68._4_4_ |
                               (uint)!bVar51 * (int)(auVar75._4_4_ + auVar75._4_4_);
                          bVar51 = (bool)((byte)(uVar6 >> 2) & 1);
                          auVar71._8_4_ =
                               (uint)bVar51 * auVar68._8_4_ |
                               (uint)!bVar51 * (int)(auVar75._8_4_ + auVar75._8_4_);
                          bVar51 = (bool)((byte)(uVar6 >> 3) & 1);
                          auVar71._12_4_ =
                               (uint)bVar51 * auVar68._12_4_ |
                               (uint)!bVar51 * (int)(auVar75._12_4_ + auVar75._12_4_);
                          auVar75 = vminps_avx(auVar71,auVar79);
                          auVar68 = vmaxps_avx(auVar75,auVar80);
                          auVar66 = vfmadd213ps_fma(auVar82,auVar68,auVar81);
                          auVar99._0_4_ = (int)auVar66._0_4_;
                          auVar99._4_4_ = (int)auVar66._4_4_;
                          auVar99._8_4_ = (int)auVar66._8_4_;
                          auVar99._12_4_ = (int)auVar66._12_4_;
                          auVar75 = vcvtdq2ps_avx(auVar99);
                          uVar6 = vcmpps_avx512vl(auVar66,auVar75,1);
                          auVar66 = vsubps_avx512vl(auVar75,auVar83);
                          bVar51 = (bool)((byte)uVar6 & 1);
                          auVar72._0_4_ =
                               (float)((uint)bVar51 * auVar66._0_4_ | (uint)!bVar51 * auVar75._0_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 1) & 1);
                          auVar72._4_4_ =
                               (float)((uint)bVar51 * auVar66._4_4_ | (uint)!bVar51 * auVar75._4_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 2) & 1);
                          auVar72._8_4_ =
                               (float)((uint)bVar51 * auVar66._8_4_ | (uint)!bVar51 * auVar75._8_4_)
                          ;
                          bVar51 = (bool)((byte)(uVar6 >> 3) & 1);
                          auVar72._12_4_ =
                               (float)((uint)bVar51 * auVar66._12_4_ |
                                      (uint)!bVar51 * auVar75._12_4_);
                          auVar75 = vfmsub231ps_fma(auVar68,auVar72,auVar84);
                          auVar75 = vfnmsub231ps_fma(auVar75,auVar72,auVar96);
                          auVar89._0_4_ = auVar75._0_4_ * auVar75._0_4_;
                          auVar89._4_4_ = auVar75._4_4_ * auVar75._4_4_;
                          auVar89._8_4_ = auVar75._8_4_ * auVar75._8_4_;
                          auVar89._12_4_ = auVar75._12_4_ * auVar75._12_4_;
                          auVar68 = vfmadd213ps_avx512vl(auVar52,auVar75,auVar91);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar92);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar93);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar94);
                          auVar68 = vfmadd213ps_avx512vl(auVar68,auVar75,auVar81);
                          auVar75 = vfmadd213ps_avx512vl(auVar68,auVar89,auVar75);
                          auVar68 = vaddps_avx512vl(auVar75,auVar83);
                          auVar90._0_4_ = (int)auVar72._0_4_;
                          auVar90._4_4_ = (int)auVar72._4_4_;
                          auVar90._8_4_ = (int)auVar72._8_4_;
                          auVar90._12_4_ = (int)auVar72._12_4_;
                          auVar75 = vpslld_avx(auVar90,0x17);
                          auVar75 = vpaddd_avx(auVar75,auVar95);
                          auVar75 = vfmadd213ps_fma(auVar75,auVar68,auVar83);
                          auVar75 = vdivps_avx512vl(auVar65,auVar75);
                          auVar75 = vfmsub231ps_fma(auVar73,auVar73,auVar75);
                          break;
                        case 6:
                          puVar5 = (undefined4 *)
                                   (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar1 = *puVar5;
                          auVar66._4_4_ = uVar1;
                          auVar66._0_4_ = uVar1;
                          auVar66._8_4_ = uVar1;
                          auVar66._12_4_ = uVar1;
                          uVar1 = puVar5[1];
                          auVar68._4_4_ = uVar1;
                          auVar68._0_4_ = uVar1;
                          auVar68._8_4_ = uVar1;
                          auVar68._12_4_ = uVar1;
                          auVar75 = vfmadd213ps_avx512vl(auVar66,auVar73,auVar68);
                          auVar75 = vmaxps_avx512vl(auVar75,auVar64);
                          auVar68 = vminps_avx(auVar75,auVar83);
                          auVar75._0_4_ = auVar68._0_4_ * auVar73._0_4_;
                          auVar75._4_4_ = auVar68._4_4_ * auVar73._4_4_;
                          auVar75._8_4_ = auVar68._8_4_ * auVar73._8_4_;
                          auVar75._12_4_ = auVar68._12_4_ * auVar73._12_4_;
                        }
                        *(undefined1 (*) [16])((long)pvVar38 + uVar37 * 0x10) = auVar75;
                        uVar37 = uVar37 + 1;
                      } while (uVar37 != uVar39);
                    }
                    pvVar38 = (void *)((long)pvVar38 + (long)(int)(uVar39 * 4) * 4);
                    bVar51 = iVar29 != iVar49;
                    iVar29 = iVar29 + 1;
                  } while (bVar51);
                }
                local_240 = local_240 + 1;
                iVar34 = iVar34 + uVar47 * 4;
              } while (local_240 != uVar30);
            }
            if (local_1b8.data != (void *)0x0) {
              operator_delete(local_1b8.data,
                              CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize) -
                              (long)local_1b8.data);
            }
            iVar33 = 0;
            goto LAB_004163b5;
          }
          convdw5x5s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
        }
        else {
          convdw5x5s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
        }
      }
    }
LAB_00415793:
    pLVar3 = this->activation;
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
    }
  }
  else {
    if (iVar35 != 8) {
      if (iVar35 != 0x10) goto LAB_00414f27;
      iVar34 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar29 = (this->super_ConvolutionDepthWise).kernel_h;
      uVar39 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
      uVar47 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
      bVar17 = iVar29 == 3;
      bVar18 = iVar34 == 3;
      bVar16 = uVar39 == 0;
      bVar51 = uVar47 == 0;
      bVar50 = ((bVar17 && bVar18) && bVar16) && bVar51;
      iVar35 = (this->super_ConvolutionDepthWise).stride_w;
      iVar33 = (this->super_ConvolutionDepthWise).stride_h;
      if ((iVar33 == 1 && iVar35 == 1) && (((bVar17 && bVar18) && bVar16) && bVar51)) {
        convdw3x3s1_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,(Option *)CONCAT71(uVar46,bVar50));
      }
      else if ((((bVar17 && bVar18) && bVar16) && bVar51) && (iVar33 == 2 && iVar35 == 2)) {
        convdw3x3s2_pack16_avx512
                  (&local_208,top_blob,&this->weight_data_tm,
                   &(this->super_ConvolutionDepthWise).bias_data,
                   (Option *)CONCAT71(uVar46,bVar50 && (iVar33 == 2 && iVar35 == 2)));
      }
      else {
        pOVar44 = (Option *)CONCAT71(uVar46,iVar33 == 1);
        bVar51 = iVar29 != 5 || iVar34 != 5;
        if ((iVar35 != 1 || iVar33 != 1) || ((bVar51 || uVar39 != 0) || uVar47 != 0)) {
          if (((bVar51 || uVar39 != 0) || uVar47 != 0) || (iVar35 != 2 || iVar33 != 2)) {
            uVar39 = iVar29 * iVar34;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_1b8,(long)(int)uVar39,
                       (allocator_type *)&local_168);
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar34 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar29 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar35 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar33 = 0;
              iVar36 = 0;
              iVar40 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar42 = 0;
                  do {
                    *(int *)((long)local_1b8.data + (iVar33 + lVar42) * 4) = iVar36;
                    iVar36 = iVar36 + (this->super_ConvolutionDepthWise).dilation_w;
                    lVar42 = lVar42 + 1;
                  } while ((int)lVar42 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar33 = iVar33 + (int)lVar42;
                }
                iVar36 = iVar36 + (iVar27 * iVar34 - iVar29 * iVar35);
                iVar40 = iVar40 + 1;
              } while (iVar40 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < (int)uVar32) {
              iVar34 = 0;
              local_238 = 0;
              do {
                if (-1 < iVar49) {
                  pauVar48 = (undefined1 (*) [64])
                             (top_blob->cstep * local_238 * top_blob->elemsize +
                             (long)top_blob->data);
                  pvVar38 = (this->weight_data_tm).data;
                  iVar29 = 0;
                  do {
                    if (-1 < iVar28) {
                      iVar35 = 0;
                      do {
                        if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                          auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar76 = *(undefined1 (*) [64])
                                     ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                     local_238 * 0x40);
                        }
                        if (0 < (int)uVar39) {
                          uVar37 = 0;
                          pauVar45 = (undefined1 (*) [64])((long)iVar34 * 4 + (long)pvVar38);
                          do {
                            auVar76 = vfmadd231ps_avx512f(auVar76,*(undefined1 (*) [64])
                                                                   ((long)&((Allocator *)
                                                                           ((long)local_208.data +
                                                                           (long)*(int *)((long)
                                                  local_1b8.data + uVar37 * 4) * 8 * 8))->
                                                  _vptr_Allocator +
                                                  (long)((this->super_ConvolutionDepthWise).stride_w
                                                         * iVar35 * 0x10) * 4 +
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)iVar29 *
                                                  (long)local_208.w *
                                                  CONCAT44(local_208.elemsize._4_4_,
                                                           (int)local_208.elemsize) +
                                                  local_208.cstep * local_238 *
                                                  CONCAT44(local_208.elemsize._4_4_,
                                                           (int)local_208.elemsize)),*pauVar45);
                            uVar37 = uVar37 + 1;
                            pauVar45 = pauVar45 + 1;
                          } while (uVar39 != uVar37);
                        }
                        *pauVar48 = auVar76;
                        pauVar48 = pauVar48 + 1;
                        bVar51 = iVar35 != iVar28;
                        iVar35 = iVar35 + 1;
                      } while (bVar51);
                    }
                    bVar51 = iVar29 != iVar49;
                    iVar29 = iVar29 + 1;
                  } while (bVar51);
                }
                local_238 = local_238 + 1;
                iVar34 = iVar34 + uVar39 * 0x10;
              } while (local_238 != uVar30);
            }
            pLVar3 = this->activation;
            if (pLVar3 != (Layer *)0x0) {
              (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
            }
            goto LAB_0041620f;
          }
          convdw5x5s2_pack16_avx512
                    (&local_208,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
        }
        else {
          convdw5x5s1_pack16_avx512
                    (&local_208,top_blob,&this->weight_data_tm,
                     &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
        }
      }
      goto LAB_00415793;
    }
    iVar34 = (this->super_ConvolutionDepthWise).kernel_w;
    iVar29 = (this->super_ConvolutionDepthWise).kernel_h;
    uVar47 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
    uVar41 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
    bVar17 = iVar29 == 3;
    bVar18 = iVar34 == 3;
    bVar16 = uVar47 == 0;
    bVar51 = uVar41 == 0;
    bVar50 = ((bVar17 && bVar18) && bVar16) && bVar51;
    iVar35 = (this->super_ConvolutionDepthWise).stride_w;
    iVar33 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar33 == 1 && iVar35 == 1) && (((bVar17 && bVar18) && bVar16) && bVar51)) {
      convdw3x3s1_pack8_avx
                (&local_208,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,(Option *)CONCAT71(uVar46,bVar50));
      goto LAB_00415793;
    }
    if ((((bVar17 && bVar18) && bVar16) && bVar51) && (iVar33 == 2 && iVar35 == 2)) {
      convdw3x3s2_pack8_avx
                (&local_208,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,
                 (Option *)CONCAT71(uVar46,bVar50 && (iVar33 == 2 && iVar35 == 2)));
      goto LAB_00415793;
    }
    pOVar44 = (Option *)CONCAT71(uVar46,iVar33 == 1);
    if ((iVar35 == 1 && iVar33 == 1) &&
        (((iVar29 == 5 && iVar34 == 5) && uVar47 == 0) && uVar41 == 0)) {
      convdw5x5s1_pack8_avx
                (&local_208,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
      goto LAB_00415793;
    }
    if ((((iVar29 == 5 && iVar34 == 5) && uVar47 == 0) && uVar41 == 0) &&
        (iVar35 == 2 && iVar33 == 2)) {
      convdw5x5s2_pack8_avx
                (&local_208,top_blob,&this->weight_data_tm,
                 &(this->super_ConvolutionDepthWise).bias_data,pOVar44);
      goto LAB_00415793;
    }
    uVar47 = iVar29 * iVar34;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1b8,(long)(int)uVar47,
               (allocator_type *)&local_168);
    if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
      iVar34 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar29 = (this->super_ConvolutionDepthWise).dilation_w;
      iVar35 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar33 = 0;
      iVar36 = 0;
      iVar40 = 0;
      do {
        if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
          lVar42 = 0;
          do {
            *(int *)((long)local_1b8.data + (iVar40 + lVar42) * 4) = iVar36;
            iVar36 = iVar36 + (this->super_ConvolutionDepthWise).dilation_w;
            lVar42 = lVar42 + 1;
          } while ((int)lVar42 < (this->super_ConvolutionDepthWise).kernel_w);
          iVar40 = iVar40 + (int)lVar42;
        }
        iVar36 = iVar36 + (iVar27 * iVar34 - iVar29 * iVar35);
        iVar33 = iVar33 + 1;
      } while (iVar33 < (this->super_ConvolutionDepthWise).kernel_h);
    }
    if (0 < (int)uVar32) {
      iVar34 = 0;
      local_240 = 0;
      do {
        if (-1 < iVar49) {
          pvVar38 = (void *)(top_blob->cstep * local_240 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar4 = (this->weight_data_tm).data;
          iVar29 = 0;
          do {
            if (-1 < iVar28) {
              uVar37 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar76 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                      local_240 * 0x20));
                }
                auVar78 = auVar76._0_32_;
                if (0 < (int)uVar47) {
                  lVar42 = 0;
                  do {
                    auVar64 = vfmadd231ps_fma(auVar76._0_32_,
                                              *(undefined1 (*) [32])
                                               ((long)&((Allocator *)
                                                       ((long)local_208.data +
                                                       (long)*(int *)((long)local_1b8.data + lVar42)
                                                       * 4 * 8))->_vptr_Allocator +
                                               (long)((this->super_ConvolutionDepthWise).stride_w *
                                                      (int)uVar37 * 8) * 4 +
                                               (long)(this->super_ConvolutionDepthWise).stride_h *
                                               (long)iVar29 *
                                               (long)local_208.w *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize) +
                                               local_208.cstep * local_240 *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize)),
                                              *(undefined1 (*) [32])
                                               ((long)pvVar4 + lVar42 * 8 + (long)iVar34 * 4));
                    auVar76 = ZEXT1664(auVar64);
                    auVar78 = ZEXT1632(auVar64);
                    lVar42 = lVar42 + 4;
                  } while ((ulong)uVar47 << 2 != lVar42);
                }
                *(undefined1 (*) [32])((long)pvVar38 + uVar37 * 0x20) = auVar78;
                uVar37 = uVar37 + 1;
              } while (uVar37 != uVar39);
            }
            pvVar38 = (void *)((long)pvVar38 + (long)(int)(uVar39 * 8) * 4);
            bVar51 = iVar29 != iVar49;
            iVar29 = iVar29 + 1;
          } while (bVar51);
        }
        local_240 = local_240 + 1;
        iVar34 = iVar34 + uVar47 * 8;
      } while (local_240 != uVar30);
    }
    pLVar3 = this->activation;
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
    }
LAB_0041620f:
    if (local_1b8.data != (void *)0x0) {
      operator_delete(local_1b8.data,
                      CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize) -
                      (long)local_1b8.data);
    }
  }
  iVar33 = 0;
LAB_004163b5:
  piVar2 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_208.data != (Allocator *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}